

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O0

void __thiscall Emitter::convertUnits(Emitter *this,Network *network)

{
  double dVar1;
  double dVar2;
  double pUcf;
  double qUcf;
  Network *network_local;
  Emitter *this_local;
  
  dVar1 = Network::ucf(network,FLOW);
  dVar2 = Network::ucf(network,PRESSURE);
  dVar2 = pow(dVar2,this->expon);
  this->flowCoeff = (dVar2 / dVar1) * this->flowCoeff;
  return;
}

Assistant:

void Emitter::convertUnits(Network* network)
{
    // ... get units conversion factors

    double qUcf = network->ucf(Units::FLOW);
    double pUcf = network->ucf(Units::PRESSURE);

    // ... convert flowCoeff from user flow units per psi (or meter)
    //     to cfs per foot of head

    flowCoeff *= pow(pUcf, expon) / qUcf;
}